

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  char *item_text;
  ImGuiListClipper clipper;
  ImVec2 size;
  char *local_70;
  ImGuiListClipper local_64;
  ImGuiContext *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  iVar6 = 7;
  if (items_count < 7) {
    iVar6 = items_count;
  }
  if (-1 < height_in_items) {
    iVar6 = height_in_items;
  }
  fVar7 = GetTextLineHeightWithSpacing();
  local_48 = pIVar3;
  fVar8 = (pIVar3->Style).FramePadding.y;
  auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar7 * ((float)iVar6 + 0.25) + fVar8 + fVar8)));
  local_38.x = 0.0;
  local_38.y = auVar2._0_4_;
  bVar4 = BeginListBox(label,&local_38);
  if (bVar4) {
    ImGuiListClipper::ImGuiListClipper(&local_64);
    fVar8 = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin(&local_64,items_count,fVar8);
    bVar4 = false;
    while (bVar5 = ImGuiListClipper::Step(&local_64), iVar6 = local_64.DisplayStart, bVar5) {
      for (; iVar6 < local_64.DisplayEnd; iVar6 = iVar6 + 1) {
        bVar5 = (*items_getter)(data,iVar6,&local_70);
        if (!bVar5) {
          local_70 = "*Unknown item*";
        }
        PushID(iVar6);
        iVar1 = *current_item;
        local_40.x = 0.0;
        local_40.y = 0.0;
        bVar5 = Selectable(local_70,iVar6 == iVar1,0,&local_40);
        if (bVar5) {
          *current_item = iVar6;
          bVar4 = true;
        }
        if (iVar6 == iVar1) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    EndListBox();
    if (bVar4 != false) {
      MarkItemEdited((local_48->CurrentWindow->DC).LastItemId);
    }
    ImGuiListClipper::~ImGuiListClipper(&local_64);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Calculate size from "height_in_items"
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items + 0.25f;
    ImVec2 size(0.0f, ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f));

    if (!BeginListBox(label, size))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different height,
    // you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            const bool item_selected = (i == *current_item);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    EndListBox();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}